

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCompare(Expr *pA,Expr *pB,int iTab)

{
  uint uVar1;
  int iVar2;
  u32 combinedFlags;
  int iTab_local;
  Expr *pB_local;
  Expr *pA_local;
  
  if ((pA == (Expr *)0x0) || (pB == (Expr *)0x0)) {
    pA_local._4_4_ = 2;
    if (pB == pA) {
      pA_local._4_4_ = 0;
    }
  }
  else {
    uVar1 = pA->flags | pB->flags;
    if ((uVar1 & 0x400) == 0) {
      if (pA->op == pB->op) {
        if (((pA->op != 0x98) && (pA->op != 0x9a)) && ((pA->u).zToken != (char *)0x0)) {
          if (pA->op == 0x97) {
            iVar2 = sqlite3StrICmp((pA->u).zToken,(pB->u).zToken);
            if (iVar2 != 0) {
              return 2;
            }
          }
          else {
            iVar2 = strcmp((pA->u).zToken,(pB->u).zToken);
            if (iVar2 != 0) {
              if (pA->op != '5') {
                return 2;
              }
              return 1;
            }
          }
        }
        if ((pA->flags & 0x10) == (pB->flags & 0x10)) {
          if ((uVar1 & 0x4000) == 0) {
            if ((uVar1 & 0x800) != 0) {
              return 2;
            }
            iVar2 = sqlite3ExprCompare(pA->pLeft,pB->pLeft,iTab);
            if (iVar2 != 0) {
              return 2;
            }
            iVar2 = sqlite3ExprCompare(pA->pRight,pB->pRight,iTab);
            if (iVar2 != 0) {
              return 2;
            }
            iVar2 = sqlite3ExprListCompare((pA->x).pList,(pB->x).pList,iTab);
            if (iVar2 != 0) {
              return 2;
            }
            if (((uVar1 & 0x2000) == 0) && (pA->op != 'a')) {
              if (pA->iColumn != pB->iColumn) {
                return 2;
              }
              if ((pA->iTable != pB->iTable) && ((pA->iTable != iTab || (-1 < pB->iTable)))) {
                return 2;
              }
            }
          }
          pA_local._4_4_ = 0;
        }
        else {
          pA_local._4_4_ = 2;
        }
      }
      else if ((pA->op == '5') && (iVar2 = sqlite3ExprCompare(pA->pLeft,pB,iTab), iVar2 < 2)) {
        pA_local._4_4_ = 1;
      }
      else if ((pB->op == '5') && (iVar2 = sqlite3ExprCompare(pA,pB->pLeft,iTab), iVar2 < 2)) {
        pA_local._4_4_ = 1;
      }
      else {
        pA_local._4_4_ = 2;
      }
    }
    else if (((pA->flags & pB->flags & 0x400) == 0) || ((pA->u).iValue != (pB->u).iValue)) {
      pA_local._4_4_ = 2;
    }
    else {
      pA_local._4_4_ = 0;
    }
  }
  return pA_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCompare(Expr *pA, Expr *pB, int iTab){
  u32 combinedFlags;
  if( pA==0 || pB==0 ){
    return pB==pA ? 0 : 2;
  }
  combinedFlags = pA->flags | pB->flags;
  if( combinedFlags & EP_IntValue ){
    if( (pA->flags&pB->flags&EP_IntValue)!=0 && pA->u.iValue==pB->u.iValue ){
      return 0;
    }
    return 2;
  }
  if( pA->op!=pB->op ){
    if( pA->op==TK_COLLATE && sqlite3ExprCompare(pA->pLeft, pB, iTab)<2 ){
      return 1;
    }
    if( pB->op==TK_COLLATE && sqlite3ExprCompare(pA, pB->pLeft, iTab)<2 ){
      return 1;
    }
    return 2;
  }
  if( pA->op!=TK_COLUMN && pA->op!=TK_AGG_COLUMN && pA->u.zToken ){
    if( pA->op==TK_FUNCTION ){
      if( sqlite3StrICmp(pA->u.zToken,pB->u.zToken)!=0 ) return 2;
    }else if( strcmp(pA->u.zToken,pB->u.zToken)!=0 ){
      return pA->op==TK_COLLATE ? 1 : 2;
    }
  }
  if( (pA->flags & EP_Distinct)!=(pB->flags & EP_Distinct) ) return 2;
  if( ALWAYS((combinedFlags & EP_TokenOnly)==0) ){
    if( combinedFlags & EP_xIsSelect ) return 2;
    if( sqlite3ExprCompare(pA->pLeft, pB->pLeft, iTab) ) return 2;
    if( sqlite3ExprCompare(pA->pRight, pB->pRight, iTab) ) return 2;
    if( sqlite3ExprListCompare(pA->x.pList, pB->x.pList, iTab) ) return 2;
    if( ALWAYS((combinedFlags & EP_Reduced)==0) && pA->op!=TK_STRING ){
      if( pA->iColumn!=pB->iColumn ) return 2;
      if( pA->iTable!=pB->iTable 
       && (pA->iTable!=iTab || NEVER(pB->iTable>=0)) ) return 2;
    }
  }
  return 0;
}